

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHashSTL.cxx
# Opt level: O0

void __thiscall
cmsys::
hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::~hash_map(hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
            *this)

{
  hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  
  hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  ::~hashtable(&this->_M_ht);
  return;
}

Assistant:

static bool test_hash_map()
{
  typedef kwsys::hash_map<const char*, int> mtype;
  mtype m;
  const char* keys[] = { "hello", "world" };
  m[keys[0]] = 1;
  m.insert(mtype::value_type(keys[1], 2));
  int sum = 0;
  for (mtype::iterator mi = m.begin(); mi != m.end(); ++mi) {
    std::cout << "Found entry [" << mi->first << "," << mi->second << "]"
              << std::endl;
    sum += mi->second;
  }
  return sum == 3;
}